

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall QPDFObjectHandle::objectWarning(QPDFObjectHandle *this,string *warning)

{
  QPDF *qpdf;
  QPDF *context;
  string description;
  QPDF *local_e8;
  string local_e0;
  string local_c0;
  QPDFExc local_a0;
  
  local_e8 = (QPDF *)0x0;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  QPDFObject::getDescription
            ((this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&local_e8,&local_c0);
  qpdf = local_e8;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  QPDFExc::QPDFExc(&local_a0,qpdf_e_object,&local_e0,&local_c0,0,warning);
  warn(qpdf,&local_a0);
  QPDFExc::~QPDFExc(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::objectWarning(std::string const& warning) const
{
    QPDF* context = nullptr;
    std::string description;
    // Type checks above guarantee that the object is initialized.
    obj->getDescription(context, description);
    // Null context handled by warn
    warn(context, QPDFExc(qpdf_e_object, "", description, 0, warning));
}